

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall rsg::VariableManager::popVariableScope(VariableManager *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppVVar3;
  reference ppVVar4;
  value_type local_38;
  Variable *liveVar;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *parenLiveVars;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *curLiveVars;
  VariableScope *parentScope;
  VariableScope *curScope;
  VariableManager *this_local;
  
  curScope = (VariableScope *)this;
  parentScope = getCurVariableScope(this);
  sVar2 = std::vector<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>::size
                    (&this->m_variableScopeStack);
  if (1 < sVar2) {
    sVar2 = std::vector<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>::size
                      (&this->m_variableScopeStack);
    ppVVar3 = std::vector<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>::operator[]
                        (&this->m_variableScopeStack,sVar2 - 2);
    curLiveVars = &(*ppVVar3)->m_declaredVariables;
    parenLiveVars = VariableScope::getLiveVariables(parentScope);
    liveVar = (Variable *)VariableScope::getLiveVariables((VariableScope *)curLiveVars);
    while (bVar1 = std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::empty
                             (parenLiveVars), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppVVar4 = std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::back(parenLiveVars);
      local_38 = *ppVVar4;
      std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back
                ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)liveVar,&local_38);
      std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::pop_back(parenLiveVars);
    }
  }
  std::vector<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>::pop_back
            (&this->m_variableScopeStack);
  return;
}

Assistant:

void VariableManager::popVariableScope (void)
{
	VariableScope& curScope = getCurVariableScope();

	// Migrate live variables to parent scope.
	// Variables allocated in child scopes can be declared in any parent scope but not the other way around.
	if (m_variableScopeStack.size() > 1)
	{
		VariableScope&		parentScope		= *m_variableScopeStack[m_variableScopeStack.size()-2];
		vector<Variable*>&	curLiveVars		= curScope.getLiveVariables();
		vector<Variable*>&	parenLiveVars	= parentScope.getLiveVariables();

		while (!curLiveVars.empty())
		{
			Variable* liveVar = curLiveVars.back();
			parenLiveVars.push_back(liveVar);
			curLiveVars.pop_back();
		}
	}

	// All variables should be either migrated to parent or declared (in case of root scope).
	DE_ASSERT(curScope.getLiveVariables().size() == 0);

	m_variableScopeStack.pop_back();
}